

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O0

void __thiscall
myHashMap<wallet>::myHashMap
          (myHashMap<wallet> *this,uint tableSize,_func_uint_myString_ptr_uint *hashF)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  myBucket_chain<wallet> *pmVar5;
  ulong uVar6;
  myBucket_chain<wallet> *local_60;
  _func_uint_myString_ptr_uint *hashF_local;
  uint tableSize_local;
  myHashMap<wallet> *this_local;
  
  this->tableSize = tableSize;
  uVar2 = CONCAT44(0,tableSize);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pmVar5 = (myBucket_chain<wallet> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_60 = pmVar5;
    do {
      myBucket_chain<wallet>::myBucket_chain(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pmVar5 + uVar2);
  }
  this->table = pmVar5;
  this->hashFunc = hashF;
  return;
}

Assistant:

myHashMap(unsigned tableSize ,unsigned (*hashF)(const myString&, unsigned )) {

        this->tableSize = tableSize;

        this->table = new myBucket_chain<T>  [tableSize] ;

        this->hashFunc = hashF;

    }